

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# luajit.c
# Opt level: O2

void lstop(lua_State *L,lua_Debug *ar)

{
  undefined8 uVar1;
  
  lua_sethook(L,0,0,0);
  luaL_where(L,0);
  uVar1 = lua_tolstring(L,0xffffffffffffffff,0);
  lua_pushfstring(L,"%sinterrupted!",uVar1);
  lua_error(L);
  return;
}

Assistant:

static void lstop(lua_State *L, lua_Debug *ar)
{
  (void)ar;  /* unused arg. */
  lua_sethook(L, NULL, 0, 0);
  /* Avoid luaL_error -- a C hook doesn't add an extra frame. */
  luaL_where(L, 0);
  lua_pushfstring(L, "%sinterrupted!", lua_tostring(L, -1));
  lua_error(L);
}